

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

MPEG2VideoDescriptor * __thiscall
ASDCP::MXF::MPEG2VideoDescriptor::InitFromTLVSet(MPEG2VideoDescriptor *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    CDCIEssenceDescriptor::InitFromTLVSet(&this->super_CDCIEssenceDescriptor,TLVSet);
    if (-1 < *(int *)&(this->super_CDCIEssenceDescriptor).super_GenericPictureEssenceDescriptor.
                      super_FileDescriptor.super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_MPEG2VideoDescriptor_SingleSequence);
      TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).super_GenericPictureEssenceDescriptor.
                       super_FileDescriptor.super_GenericDescriptor.super_InterchangeObject.
                       super_KLVPacket._vptr_KLVPacket;
      *(bool *)((long)&TLVSet[0xc].m_Lookup + 1) = iVar1 == Kumu::RESULT_OK;
      if (-1 < iVar1) {
        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_MPEG2VideoDescriptor_ConstantBFrames);
        TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).super_GenericPictureEssenceDescriptor.
                         super_FileDescriptor.super_GenericDescriptor.super_InterchangeObject.
                         super_KLVPacket._vptr_KLVPacket;
        *(bool *)((long)&TLVSet[0xc].m_Lookup + 3) = iVar1 == Kumu::RESULT_OK;
        if (-1 < iVar1) {
          pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_MPEG2VideoDescriptor_CodedContentType);
          TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).super_GenericPictureEssenceDescriptor
                           .super_FileDescriptor.super_GenericDescriptor.super_InterchangeObject.
                           super_KLVPacket._vptr_KLVPacket;
          *(bool *)((long)&TLVSet[0xc].m_Lookup + 5) = iVar1 == Kumu::RESULT_OK;
          if (-1 < iVar1) {
            pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_MPEG2VideoDescriptor_LowDelay);
            TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).
                             super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                             super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                             _vptr_KLVPacket;
            *(bool *)((long)&TLVSet[0xc].m_Lookup + 7) = iVar1 == Kumu::RESULT_OK;
            if (-1 < iVar1) {
              pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                        MDD_MPEG2VideoDescriptor_ClosedGOP);
              TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
              iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).
                               super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                               super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                               _vptr_KLVPacket;
              *(bool *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 1) = iVar1 == Kumu::RESULT_OK;
              if (-1 < iVar1) {
                pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                          MDD_MPEG2VideoDescriptor_IdenticalGOP);
                TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).
                                 super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                                 super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                                 _vptr_KLVPacket;
                *(bool *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 3) = iVar1 == Kumu::RESULT_OK;
                if (-1 < iVar1) {
                  pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                            MDD_MPEG2VideoDescriptor_MaxGOP);
                  TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
                  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                  Kumu::Result_t::~Result_t((Result_t *)&local_80);
                  iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).
                                   super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                                   super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                                   _vptr_KLVPacket;
                  *(bool *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 5) = iVar1 == Kumu::RESULT_OK
                  ;
                  if (-1 < iVar1) {
                    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                              MDD_MPEG2VideoDescriptor_BPictureCount);
                    TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
                    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                    Kumu::Result_t::~Result_t((Result_t *)&local_80);
                    iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).
                                     super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                                     super_GenericDescriptor.super_InterchangeObject.super_KLVPacket
                                     ._vptr_KLVPacket;
                    *(bool *)((long)&TLVSet[0xd].super_MemIOReader.m_p + 7) =
                         iVar1 == Kumu::RESULT_OK;
                    if (-1 < iVar1) {
                      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                MDD_MPEG2VideoDescriptor_BitRate);
                      TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar2);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                      iVar1 = *(int *)&(this->super_CDCIEssenceDescriptor).
                                       super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                                       super_GenericDescriptor.super_InterchangeObject.
                                       super_KLVPacket._vptr_KLVPacket;
                      *(bool *)&TLVSet[0xd].super_MemIOReader.m_size = iVar1 == Kumu::RESULT_OK;
                      if (-1 < iVar1) {
                        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                  MDD_MPEG2VideoDescriptor_ProfileAndLevel);
                        TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
                        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                        Kumu::Result_t::~Result_t((Result_t *)&local_80);
                        TLVSet[0xd].m_ElementMap._M_t._M_impl.field_0x1 =
                             *(int *)&(this->super_CDCIEssenceDescriptor).
                                      super_GenericPictureEssenceDescriptor.super_FileDescriptor.
                                      super_GenericDescriptor.super_InterchangeObject.
                                      super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xa14,
                "virtual ASDCP::Result_t ASDCP::MXF::MPEG2VideoDescriptor::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
MPEG2VideoDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = CDCIEssenceDescriptor::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, SingleSequence));
    SingleSequence.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, ConstantBFrames));
    ConstantBFrames.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, CodedContentType));
    CodedContentType.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, LowDelay));
    LowDelay.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, ClosedGOP));
    ClosedGOP.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, IdenticalGOP));
    IdenticalGOP.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, MaxGOP));
    MaxGOP.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, BPictureCount));
    BPictureCount.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, BitRate));
    BitRate.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(MPEG2VideoDescriptor, ProfileAndLevel));
    ProfileAndLevel.set_has_value( result == RESULT_OK );
  }
  return result;
}